

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3DbMallocRaw(sqlite3 *db,int n)

{
  int iVar1;
  int *piVar2;
  ushort uVar3;
  int iVar4;
  bool bVar5;
  LookasideSlot *in_RAX;
  void *pvVar6;
  
  if (db == (sqlite3 *)0x0) goto LAB_0014f5c2;
  if (db->mallocFailed == '\0') {
    bVar5 = true;
    if ((db->lookaside).bEnabled != '\0') {
      uVar3 = (db->lookaside).sz;
      in_RAX = (LookasideSlot *)(ulong)uVar3;
      if ((int)(uint)uVar3 < n) {
        piVar2 = (db->lookaside).anStat + 1;
        *piVar2 = *piVar2 + 1;
      }
      else {
        in_RAX = (db->lookaside).pFree;
        if (in_RAX != (LookasideSlot *)0x0) {
          (db->lookaside).pFree = in_RAX->pNext;
          iVar4 = (db->lookaside).nOut;
          iVar1 = iVar4 + 1;
          (db->lookaside).nOut = iVar1;
          piVar2 = (db->lookaside).anStat;
          *piVar2 = *piVar2 + 1;
          if ((db->lookaside).mxOut <= iVar4) {
            (db->lookaside).mxOut = iVar1;
          }
          goto LAB_0014f55b;
        }
        piVar2 = (db->lookaside).anStat + 2;
        *piVar2 = *piVar2 + 1;
      }
    }
  }
  else {
    in_RAX = (LookasideSlot *)0x0;
LAB_0014f55b:
    bVar5 = false;
  }
  if (!bVar5) {
    return in_RAX;
  }
LAB_0014f5c2:
  pvVar6 = sqlite3Malloc(n);
  if (pvVar6 == (void *)0x0 && db != (sqlite3 *)0x0) {
    db->mallocFailed = '\x01';
  }
  return pvVar6;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRaw(sqlite3 *db, int n){
  void *p;
  assert( db==0 || sqlite3_mutex_held(db->mutex) );
  assert( db==0 || db->pnBytesFreed==0 );
#ifndef SQLITE_OMIT_LOOKASIDE
  if( db ){
    LookasideSlot *pBuf;
    if( db->mallocFailed ){
      return 0;
    }
    if( db->lookaside.bEnabled ){
      if( n>db->lookaside.sz ){
        db->lookaside.anStat[1]++;
      }else if( (pBuf = db->lookaside.pFree)==0 ){
        db->lookaside.anStat[2]++;
      }else{
        db->lookaside.pFree = pBuf->pNext;
        db->lookaside.nOut++;
        db->lookaside.anStat[0]++;
        if( db->lookaside.nOut>db->lookaside.mxOut ){
          db->lookaside.mxOut = db->lookaside.nOut;
        }
        return (void*)pBuf;
      }
    }
  }
#else
  if( db && db->mallocFailed ){
    return 0;
  }
#endif
  p = sqlite3Malloc(n);
  if( !p && db ){
    db->mallocFailed = 1;
  }
  sqlite3MemdebugSetType(p, MEMTYPE_DB |
         ((db && db->lookaside.bEnabled) ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
  return p;
}